

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O1

void __thiscall
duckdb::SQLLogicTestLogger::PrintResultError
          (SQLLogicTestLogger *this,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *values,idx_t expected_column_count,bool row_wise)

{
  SQLLogicTestLogger *this_00;
  string local_70;
  undefined1 local_50 [32];
  
  local_50._0_8_ = (SQLLogicTestLogger *)(local_50 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Expected result:","");
  PrintHeader((string *)local_50);
  this_00 = (SQLLogicTestLogger *)local_50._0_8_;
  if ((SQLLogicTestLogger *)local_50._0_8_ != (SQLLogicTestLogger *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  PrintLineSep();
  PrintExpectedResult(this_00,values,expected_column_count,row_wise);
  PrintLineSep();
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Actual result:","");
  PrintHeader(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::PrintResultError(MaterializedQueryResult &result, const vector<string> &values,
                                          idx_t expected_column_count, bool row_wise) {
	PrintHeader("Expected result:");
	PrintLineSep();
	PrintExpectedResult(values, expected_column_count, row_wise);
	PrintLineSep();
	PrintHeader("Actual result:");
	PrintLineSep();
	result.Print();
}